

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_resilience_test.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_776fc3::ErrorResilienceTestLarge::DoDecode(ErrorResilienceTestLarge *this)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  ostream *poVar6;
  long lVar7;
  
  uVar2 = this->error_nframes_;
  if ((uVar2 == 0) ||
     (((this->super_EncoderTest).cfg_.g_pass & ~AOM_RC_LAST_PASS) != AOM_RC_ONE_PASS)) {
LAB_004d682c:
    bVar4 = true;
  }
  else {
    uVar5 = this->nframes_ - 1;
    if (this->error_frames_[0] == uVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"             Skipping decoding frame: ",0x26);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    }
    else {
      lVar7 = 0;
      do {
        if (uVar2 + (uVar2 == 0) + -1 == (int)lVar7) goto LAB_004d682c;
        lVar1 = lVar7 + 1;
        lVar3 = lVar7 + 1;
        lVar7 = lVar1;
      } while (this->error_frames_[lVar3] != uVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"             Skipping decoding frame: ",0x26);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if (uVar2 <= (uint)lVar1) goto LAB_004d682c;
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool DoDecode() const override {
    if (error_nframes_ > 0 &&
        (cfg_.g_pass == AOM_RC_LAST_PASS || cfg_.g_pass == AOM_RC_ONE_PASS)) {
      for (unsigned int i = 0; i < error_nframes_; ++i) {
        if (error_frames_[i] == nframes_ - 1) {
          std::cout << "             Skipping decoding frame: "
                    << error_frames_[i] << "\n";
          return false;
        }
      }
    }
    return true;
  }